

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_0::deviceProperties2
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context)

{
  PlatformInterface *vkp;
  TestStatus *pTVar1;
  int iVar2;
  TestError *pTVar3;
  long lVar4;
  ulong uVar5;
  RefBase<vk::VkInstance_s_*> local_878;
  TestStatus *local_858;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  VkPhysicalDeviceProperties2KHR extProperties;
  InstanceDriver vki;
  VkPhysicalDeviceProperties coreProperties;
  
  vkp = *(PlatformInterface **)(this + 8);
  createInstanceWithExtension((Move<vk::VkInstance_s_*> *)&extProperties,vkp,(char *)context);
  local_878.m_data.deleter.m_allocator = (VkAllocationCallbacks *)extProperties.properties._0_8_;
  local_878.m_data.object = (VkInstance_s *)extProperties._0_8_;
  local_878.m_data.deleter.m_destroyInstance = (DestroyInstanceFunc)extProperties.pNext;
  extProperties.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  extProperties._4_4_ = 0;
  extProperties.pNext = (void *)0x0;
  extProperties.properties.apiVersion = 0;
  extProperties.properties.driverVersion = 0;
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase
            ((RefBase<vk::VkInstance_s_*> *)&extProperties);
  ::vk::InstanceDriver::InstanceDriver(&vki,vkp,local_878.m_data.object);
  local_858 = __return_storage_ptr__;
  ::vk::enumeratePhysicalDevices(&devices,&vki.super_InstanceInterface,local_878.m_data.object);
  uVar5 = 0;
  while( true ) {
    if ((ulong)((long)devices.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)devices.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extProperties,"Querying device properties succeeded",
                 (allocator<char> *)&coreProperties);
      pTVar1 = local_858;
      tcu::TestStatus::pass(local_858,(string *)&extProperties);
      std::__cxx11::string::~string((string *)&extProperties);
      std::_Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
      ~_Vector_base(&devices.
                     super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   );
      ::vk::InstanceDriver::~InstanceDriver(&vki);
      ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(&local_878);
      return pTVar1;
    }
    extProperties.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2_KHR;
    extProperties.pNext = (void *)0x0;
    ::vk::InstanceDriver::getPhysicalDeviceProperties
              (&vki,devices.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar5],&coreProperties);
    ::vk::InstanceDriver::getPhysicalDeviceProperties2KHR
              (&vki,devices.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar5],&extProperties);
    if (extProperties.sType != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2_KHR) break;
    lVar4 = 8;
    if (extProperties.pNext != (void *)0x0) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,(char *)0x0,"extProperties.pNext == DE_NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                 ,0x8ce);
      goto LAB_00484187;
    }
    while (lVar4 + 0x10 != 0x778) {
      iVar2 = bcmp(coreProperties.deviceName + *(long *)(&UNK_00946328 + lVar4) + -0x14,
                   extProperties.properties.deviceName + *(long *)(&UNK_00946328 + lVar4) + -0x14,
                   *(size_t *)
                    ((long)&api::(anonymous_namespace)::s_physicalDevicePropertiesOffsetTable +
                    lVar4));
      lVar4 = lVar4 + 0x10;
      if (iVar2 != 0) {
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,
                   "Mismatch between properties reported by vkGetPhysicalDeviceProperties and vkGetPhysicalDeviceProperties2KHR"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x8dc);
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    uVar5 = uVar5 + 1;
  }
  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar3,(char *)0x0,
             "extProperties.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2_KHR",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
             ,0x8cd);
LAB_00484187:
  __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus deviceProperties2 (Context& context)
{
	const PlatformInterface&		vkp			= context.getPlatformInterface();
	const Unique<VkInstance>		instance	(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki			(vkp, *instance);
	const vector<VkPhysicalDevice>	devices		= enumeratePhysicalDevices(vki, *instance);

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		VkPhysicalDeviceProperties		coreProperties;
		VkPhysicalDeviceProperties2KHR	extProperties;

		extProperties.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2_KHR;
		extProperties.pNext = DE_NULL;

		vki.getPhysicalDeviceProperties(devices[deviceNdx], &coreProperties);
		vki.getPhysicalDeviceProperties2KHR(devices[deviceNdx], &extProperties);

		TCU_CHECK(extProperties.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2_KHR);
		TCU_CHECK(extProperties.pNext == DE_NULL);

		// We can't use memcmp() here because the structs may contain padding bytes that drivers may or may not
		// have written while writing the data and memcmp will compare them anyway, so we iterate through the
		// valid bytes for each field in the struct and compare only the valid bytes for each one.
		for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(s_physicalDevicePropertiesOffsetTable); propNdx++)
		{
			const size_t offset					= s_physicalDevicePropertiesOffsetTable[propNdx].offset;
			const size_t size					= s_physicalDevicePropertiesOffsetTable[propNdx].size;

			const deUint8* corePropertyBytes	= reinterpret_cast<deUint8*>(&coreProperties) + offset;
			const deUint8* extPropertyBytes		= reinterpret_cast<deUint8*>(&extProperties.properties) + offset;

			if (deMemCmp(corePropertyBytes, extPropertyBytes, size) != 0)
				TCU_FAIL("Mismatch between properties reported by vkGetPhysicalDeviceProperties and vkGetPhysicalDeviceProperties2KHR");
		}
	}

	return tcu::TestStatus::pass("Querying device properties succeeded");
}